

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raft_functional_common.hxx
# Opt level: O3

void __thiscall raft_functional_common::TestSm::~TestSm(TestSm *this)

{
  _List_node_base *p_Var1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  _List_node_base *p_Var2;
  
  (this->super_state_machine)._vptr_state_machine = (_func_int **)&PTR__TestSm_0061abf8;
  p_Var2 = (this->serversForCommit).super__List_base<int,_std::allocator<int>_>._M_impl._M_node.
           super__List_node_base._M_next;
  while (p_Var2 != (_List_node_base *)&this->serversForCommit) {
    p_Var1 = p_Var2->_M_next;
    operator_delete(p_Var2);
    p_Var2 = p_Var1;
  }
  std::_Rb_tree<void_*,_void_*,_std::_Identity<void_*>,_std::less<void_*>,_std::allocator<void_*>_>
  ::~_Rb_tree(&(this->openedUserCtxs)._M_t);
  this_00 = (this->lastSnapshot).super___shared_ptr<nuraft::snapshot,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  p_Var2 = (this->rollbacks).super__List_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
           ._M_node.super__List_node_base._M_next;
  while (p_Var2 != (_List_node_base *)&this->rollbacks) {
    p_Var1 = p_Var2->_M_next;
    operator_delete(p_Var2);
    p_Var2 = p_Var1;
  }
  std::
  _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_std::shared_ptr<nuraft::buffer>_>,_std::_Select1st<std::pair<const_unsigned_long,_std::shared_ptr<nuraft::buffer>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<nuraft::buffer>_>_>_>
  ::~_Rb_tree(&(this->commits)._M_t);
  std::
  _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_std::shared_ptr<nuraft::buffer>_>,_std::_Select1st<std::pair<const_unsigned_long,_std::shared_ptr<nuraft::buffer>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<nuraft::buffer>_>_>_>
  ::~_Rb_tree(&(this->preCommits)._M_t);
  return;
}

Assistant:

~TestSm() {}